

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

x86XmmReg __thiscall CodeGenGenericContext::GetXmmReg(CodeGenGenericContext *this)

{
  x86XmmReg xVar1;
  x86XmmReg xVar2;
  
  do {
    xVar1 = this->currFreeXmmReg;
    xVar2 = xVar1 + rXMM1;
    if (xVar1 == rXMM15) {
      xVar2 = rXMM0;
    }
    this->currFreeXmmReg = xVar2;
  } while ((xVar1 == this->lockedXmmRegA) || (xVar1 == this->lockedXmmRegB));
  return xVar1;
}

Assistant:

x86XmmReg CodeGenGenericContext::GetXmmReg()
{
	// Simple rotation
	x86XmmReg res = currFreeXmmReg;

#if defined(_MSC_VER) && defined(_M_X64)
	x86XmmReg lastXmmReg = rXMM5; // Less volatile registers than on x86
#elif defined(_MSC_VER)
	x86XmmReg lastXmmReg = rXMM7;
#elif defined(_M_X64)
	x86XmmReg lastXmmReg = rXMM15;
#else
	x86XmmReg lastXmmReg = rXMM7;
#endif

	if(currFreeXmmReg == lastXmmReg)
		currFreeXmmReg = rXMM0;
	else
		currFreeXmmReg = x86XmmReg(currFreeXmmReg + 1);

	if(res == lockedXmmRegA || res == lockedXmmRegB)
		return GetXmmReg();

	return res;
}